

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O2

void __thiscall
cfdcapi_common_CfdEncryptDecryptAES_Test::~cfdcapi_common_CfdEncryptDecryptAES_Test
          (cfdcapi_common_CfdEncryptDecryptAES_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(cfdcapi_common, CfdEncryptDecryptAES) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* output = nullptr;
  const char* target_data = "74657374207465737420746573742074657374";
  const char* exp_aes = "752fe203af4a4d427997e5d2c8b246530e0546b66d2982a49e333e77295dccea";
  ret = CfdEncryptAES(handle,
      "616975656F616975656F616975656F616975656F616975656F616975656F6169",
      "",
      target_data,
      &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(exp_aes, output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdDecryptAES(handle,
      "616975656F616975656F616975656F616975656F616975656F616975656F6169",
      "",
      exp_aes,
      &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("7465737420746573742074657374207465737400000000000000000000000000", output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}